

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppressionValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)610>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_02;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_03;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_04;
  bool bVar1;
  int32 iVar2;
  int iVar3;
  int iVar4;
  ClassLabelsCase CVar5;
  ModelDescription *this;
  NonMaximumSuppression *this_00;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar6;
  FeatureDescription *pFVar7;
  string *psVar8;
  CoreML *pCVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  ostream *poVar12;
  int64 iVar13;
  int64 iVar14;
  size_t sVar15;
  ArrayFeatureType_ShapeRange *pAVar16;
  SizeRange *pSVar17;
  uint64 uVar18;
  uint64 uVar19;
  Int64Vector *this_01;
  StringVector *this_02;
  ulong uVar20;
  long lVar21;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  double dVar29;
  bool local_12cb;
  bool local_12ca;
  bool local_12c9;
  bool local_12bb;
  bool local_12ba;
  bool local_12b9;
  string local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  RepeatedPtrField<CoreML::Specification::SizeRange> *local_e10;
  RepeatedPtrField<CoreML::Specification::SizeRange> *confRange_1;
  string local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  int local_d48;
  allocator local_d41;
  int numLabelNames;
  RepeatedPtrField<CoreML::Specification::SizeRange> *local_d20;
  RepeatedPtrField<CoreML::Specification::SizeRange> *coordRange;
  RepeatedPtrField<CoreML::Specification::SizeRange> *confRange;
  string local_d08;
  undefined1 local_ce3;
  byte local_ce2;
  allocator local_ce1;
  undefined1 local_ce0 [5];
  bool coordsIsRange;
  bool confIsRange;
  allocator local_cb9;
  string local_cb8;
  allocator local_c91;
  string local_c90;
  bool local_c6c;
  bool local_c6b;
  bool local_c6a;
  allocator local_c69;
  undefined1 local_c68 [4];
  bool coordsUseNew;
  bool coordsUseOld;
  bool coordsUnspecified;
  bool local_c43;
  bool local_c42;
  bool local_c41;
  bool confUseNew;
  bool confUseOld;
  size_t sStack_c40;
  bool confUnspecified;
  size_t confNewShapeDim;
  size_t confOldShapeDim;
  undefined1 local_c28 [4];
  anon_class_1_0_00000001 hasShapeRange;
  anon_class_1_0_00000001 hasEnumeratedShapes;
  anon_class_1_0_00000001 hasFlexibleShape;
  anon_class_1_0_00000001 rankOfFlexibleShape;
  FeatureType local_c08;
  string local_bf8;
  FeatureType local_bd8;
  string local_bc8;
  FeatureType local_ba8;
  string local_b98;
  FeatureType local_b78;
  string local_b68;
  stringstream local_b48 [8];
  stringstream ss_2;
  ostream local_b38 [376];
  string local_9c0;
  FeatureType local_9a0;
  string local_990;
  FeatureType local_970;
  string local_960;
  FeatureType local_940;
  string local_930;
  FeatureType local_910;
  string local_900;
  stringstream local_8e0 [8];
  stringstream ss_1;
  ostream local_8d0 [376];
  string local_758;
  FeatureType local_738;
  string local_728;
  FeatureType local_708;
  string local_6f8;
  FeatureType local_6d8;
  string local_6c8;
  FeatureType local_6a8;
  string local_698;
  stringstream local_678 [8];
  stringstream ss;
  ostream local_668 [376];
  ArrayFeatureType_ArrayDataType local_4f0;
  ArrayFeatureType_ArrayDataType local_4ec;
  ArrayFeatureType_ArrayDataType coordinates_out_type;
  ArrayFeatureType_ArrayDataType coordinates_in_type;
  ArrayFeatureType_ArrayDataType confidence_out_type;
  ArrayFeatureType_ArrayDataType confidence_in_type;
  FeatureDescription *coordinates_out;
  FeatureDescription *confidence_out;
  FeatureDescription *coordinates_in;
  FeatureDescription *confidence_in;
  string local_4b8;
  allocator local_491;
  string local_490;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_46d;
  TypeCase local_46c;
  iterator local_468;
  size_type local_460;
  undefined1 local_458 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_415;
  TypeCase local_414;
  iterator local_410;
  size_type local_408;
  undefined1 local_400 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_3bd;
  TypeCase local_3bc;
  iterator local_3b8;
  size_type local_3b0;
  undefined1 local_3a8 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_365;
  TypeCase local_364;
  iterator local_360;
  size_type local_358;
  undefined1 local_350 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_30d;
  TypeCase local_30c;
  iterator local_308;
  size_type local_300;
  undefined1 local_2f8 [67];
  allocator<CoreML::Specification::FeatureType::TypeCase> local_2b5;
  TypeCase local_2b4;
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  byte local_199;
  string *psStack_198;
  bool used_1;
  string *name_1;
  int local_188;
  int i_1;
  int coordinatesOutputIndex;
  int confidenceOutputIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  byte local_b9;
  string *psStack_b8;
  bool used;
  string *name;
  int local_a8;
  int i;
  int confidenceThresholdInputIndex;
  int iouThresholdInputIndex;
  int coordinatesInputIndex;
  int confidenceInputIndex;
  Result local_88;
  undefined1 local_60 [8];
  Result result;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *outputs;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *inputs;
  NonMaximumSuppression *nms;
  ModelDescription *description;
  Model *format_local;
  
  this = Specification::Model::description(format);
  this_00 = Specification::Model::nonmaximumsuppression(format);
  pRVar6 = Specification::ModelDescription::input(this);
  result.m_message.field_2._8_8_ = Specification::ModelDescription::output(this);
  Result::Result((Result *)local_60);
  iVar2 = Specification::Model::specificationversion(format);
  validateModelDescription(&local_88,this,iVar2);
  Result::operator=((Result *)local_60,&local_88);
  Result::~Result(&local_88);
  bVar1 = Result::good((Result *)local_60);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_60);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  iouThresholdInputIndex = -1;
  confidenceThresholdInputIndex = -1;
  i = -1;
  local_a8 = -1;
  for (name._4_4_ = 0; iVar4 = name._4_4_,
      iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                        (pRVar6), iVar4 < iVar3; name._4_4_ = name._4_4_ + 1) {
    pFVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[](pRVar6,name._4_4_);
    psStack_b8 = Specification::FeatureDescription::name_abi_cxx11_(pFVar7);
    local_b9 = 0;
    psVar8 = Specification::NonMaximumSuppression::confidenceinputfeaturename_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      iouThresholdInputIndex = name._4_4_;
      local_b9 = 1;
    }
    psVar8 = Specification::NonMaximumSuppression::coordinatesinputfeaturename_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      confidenceThresholdInputIndex = name._4_4_;
      local_b9 = 1;
    }
    psVar8 = Specification::NonMaximumSuppression::iouthresholdinputfeaturename_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      i = name._4_4_;
      local_b9 = 1;
    }
    psVar8 = Specification::NonMaximumSuppression::confidencethresholdinputfeaturename_abi_cxx11_
                       (this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      local_a8 = name._4_4_;
      local_b9 = 1;
    }
    if ((local_b9 & 1) == 0) {
      std::operator+(&local_100,"Input feature \'",psStack_b8);
      std::operator+(&local_e0,&local_100,
                     "\' was not requested by any of the input feature names (e.g. confidenceInputFeatureName)."
                    );
      Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  if (iouThresholdInputIndex == -1) {
    psVar8 = Specification::NonMaximumSuppression::confidenceinputfeaturename_abi_cxx11_(this_00);
    std::operator+(&local_140,"Expected feature \'",psVar8);
    std::operator+(&local_120,&local_140,
                   "\' (as defined by confidenceInputFeatureName) to the model is not present in the model description."
                  );
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  if (confidenceThresholdInputIndex == -1) {
    psVar8 = Specification::NonMaximumSuppression::coordinatesinputfeaturename_abi_cxx11_(this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &coordinatesOutputIndex,"Expected feature \'",psVar8);
    std::operator+(&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &coordinatesOutputIndex,
                   "\' (as defined by coordinatesInputFeatureName) to the model is not present in the model description."
                  );
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&coordinatesOutputIndex);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  i_1 = -1;
  local_188 = -1;
  for (name_1._4_4_ = 0; iVar4 = name_1._4_4_,
      iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                        ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                         result.m_message.field_2._8_8_), iVar4 < iVar3;
      name_1._4_4_ = name_1._4_4_ + 1) {
    pFVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
                        result.m_message.field_2._8_8_,name_1._4_4_);
    psStack_198 = Specification::FeatureDescription::name_abi_cxx11_(pFVar7);
    local_199 = 0;
    psVar8 = Specification::NonMaximumSuppression::confidenceoutputfeaturename_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      i_1 = name_1._4_4_;
      local_199 = 1;
    }
    psVar8 = Specification::NonMaximumSuppression::coordinatesoutputfeaturename_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((string *)psVar8);
    if (iVar4 == 0) {
      local_188 = name_1._4_4_;
      local_199 = 1;
    }
    if ((local_199 & 1) == 0) {
      std::operator+(&local_1e0,"Output feature \'",psStack_198);
      std::operator+(&local_1c0,&local_1e0,
                     "\' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName)."
                    );
      Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  if (i_1 == -1) {
    psVar8 = Specification::NonMaximumSuppression::confidenceoutputfeaturename_abi_cxx11_(this_00);
    std::operator+(&local_220,"Expected feature \'",psVar8);
    std::operator+(&local_200,&local_220,
                   "\' (as defined by confidenceOutputFeatureName) from the model is not present in the model description."
                  );
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  if (local_188 == -1) {
    psVar8 = Specification::NonMaximumSuppression::coordinatesoutputfeaturename_abi_cxx11_(this_00);
    std::operator+(&local_260,"Expected feature \'",psVar8);
    std::operator+(&local_240,&local_260,
                   "\' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description."
                  );
    Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  pCVar9 = (CoreML *)Specification::ModelDescription::input(this);
  psVar8 = Specification::NonMaximumSuppression::confidenceinputfeaturename_abi_cxx11_(this_00);
  local_2b4 = kMultiArrayType;
  local_2b0 = &local_2b4;
  local_2a8 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_2b5);
  __l_04._M_len = local_2a8;
  __l_04._M_array = local_2b0;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_2a0,__l_04,&local_2b5);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)(local_2a0 + 0x18),pCVar9,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
             (string *)local_2a0,in_R8);
  Result::operator=((Result *)local_60,(Result *)(local_2a0 + 0x18));
  Result::~Result((Result *)(local_2a0 + 0x18));
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_2a0);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_2b5);
  bVar1 = Result::good((Result *)local_60);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_60);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  pCVar9 = (CoreML *)Specification::ModelDescription::input(this);
  psVar8 = Specification::NonMaximumSuppression::coordinatesinputfeaturename_abi_cxx11_(this_00);
  local_30c = kMultiArrayType;
  local_308 = &local_30c;
  local_300 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_30d);
  __l_03._M_len = local_300;
  __l_03._M_array = local_308;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_2f8,__l_03,&local_30d);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)(local_2f8 + 0x18),pCVar9,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
             (string *)local_2f8,in_R8);
  Result::operator=((Result *)local_60,(Result *)(local_2f8 + 0x18));
  Result::~Result((Result *)(local_2f8 + 0x18));
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_2f8);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_30d);
  bVar1 = Result::good((Result *)local_60);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_60);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  if (-1 < i) {
    pCVar9 = (CoreML *)Specification::ModelDescription::input(this);
    psVar8 = Specification::NonMaximumSuppression::iouthresholdinputfeaturename_abi_cxx11_(this_00);
    local_364 = kDoubleType;
    local_360 = &local_364;
    local_358 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_365);
    __l_02._M_len = local_358;
    __l_02._M_array = local_360;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_350,__l_02,&local_365);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)(local_350 + 0x18),pCVar9,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
               (string *)local_350,in_R8);
    Result::operator=((Result *)local_60,(Result *)(local_350 + 0x18));
    Result::~Result((Result *)(local_350 + 0x18));
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_350);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_365);
    bVar1 = Result::good((Result *)local_60);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__,(Result *)local_60);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  if (-1 < local_a8) {
    pCVar9 = (CoreML *)Specification::ModelDescription::input(this);
    psVar8 = Specification::NonMaximumSuppression::confidencethresholdinputfeaturename_abi_cxx11_
                       (this_00);
    local_3bc = kDoubleType;
    local_3b8 = &local_3bc;
    local_3b0 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_3bd);
    __l_01._M_len = local_3b0;
    __l_01._M_array = local_3b8;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_3a8,__l_01,&local_3bd);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)(local_3a8 + 0x18),pCVar9,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
               (string *)local_3a8,in_R8);
    Result::operator=((Result *)local_60,(Result *)(local_3a8 + 0x18));
    Result::~Result((Result *)(local_3a8 + 0x18));
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               *)local_3a8);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_3bd);
    bVar1 = Result::good((Result *)local_60);
    if (!bVar1) {
      Result::Result(__return_storage_ptr__,(Result *)local_60);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  pCVar9 = (CoreML *)Specification::ModelDescription::output(this);
  psVar8 = Specification::NonMaximumSuppression::confidenceoutputfeaturename_abi_cxx11_(this_00);
  local_414 = kMultiArrayType;
  local_410 = &local_414;
  local_408 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_415);
  __l_00._M_len = local_408;
  __l_00._M_array = local_410;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_400,__l_00,&local_415);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)(local_400 + 0x18),pCVar9,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
             (string *)local_400,in_R8);
  Result::operator=((Result *)local_60,(Result *)(local_400 + 0x18));
  Result::~Result((Result *)(local_400 + 0x18));
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_400);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_415);
  bVar1 = Result::good((Result *)local_60);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_60);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  pCVar9 = (CoreML *)Specification::ModelDescription::output(this);
  psVar8 = Specification::NonMaximumSuppression::coordinatesoutputfeaturename_abi_cxx11_(this_00);
  local_46c = kMultiArrayType;
  local_468 = &local_46c;
  local_460 = 1;
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_46d);
  __l._M_len = local_460;
  __l._M_array = local_468;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_458,__l,&local_46d);
  validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)(local_458 + 0x18),pCVar9,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar8,
             (string *)local_458,in_R8);
  Result::operator=((Result *)local_60,(Result *)(local_458 + 0x18));
  Result::~Result((Result *)(local_458 + 0x18));
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
             *)local_458);
  std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_46d);
  bVar1 = Result::good((Result *)local_60);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_60);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  dVar29 = Specification::NonMaximumSuppression::iouthreshold(this_00);
  if ((dVar29 < 0.0) ||
     (dVar29 = Specification::NonMaximumSuppression::iouthreshold(this_00), 1.0 < dVar29)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_490,"iouThreshold must be a value between 0.0 and 1.0.",&local_491);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  dVar29 = Specification::NonMaximumSuppression::confidencethreshold(this_00);
  if (dVar29 < 0.0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4b8,
               "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0."
               ,(allocator *)((long)&confidence_in + 7));
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&confidence_in + 7));
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  pRVar6 = Specification::ModelDescription::input(this);
  coordinates_in =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                 (pRVar6,iouThresholdInputIndex);
  pRVar6 = Specification::ModelDescription::input(this);
  confidence_out =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                 (pRVar6,confidenceThresholdInputIndex);
  pRVar6 = Specification::ModelDescription::output(this);
  coordinates_out =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                 (pRVar6,i_1);
  pRVar6 = Specification::ModelDescription::output(this);
  _confidence_out_type =
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::operator[]
                 (pRVar6,local_188);
  pFVar10 = Specification::FeatureDescription::type(coordinates_in);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  coordinates_in_type = Specification::ArrayFeatureType::datatype(pAVar11);
  pFVar10 = Specification::FeatureDescription::type(coordinates_out);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  coordinates_out_type = Specification::ArrayFeatureType::datatype(pAVar11);
  pFVar10 = Specification::FeatureDescription::type(confidence_out);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  local_4ec = Specification::ArrayFeatureType::datatype(pAVar11);
  pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  local_4f0 = Specification::ArrayFeatureType::datatype(pAVar11);
  if (((coordinates_in_type != coordinates_out_type) || (coordinates_in_type != local_4ec)) ||
     (coordinates_in_type != local_4f0)) {
    std::__cxx11::stringstream::stringstream(local_678);
    std::operator<<(local_668,
                    "\'confidence\' and \'coordinates\' must use a same element type, but ");
    poVar12 = std::operator<<(local_668,"\'input confidence\' is ");
    pFVar10 = Specification::FeatureDescription::type(coordinates_in);
    FeatureType::FeatureType(&local_6a8,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_698,&local_6a8);
    poVar12 = std::operator<<(poVar12,(string *)&local_698);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_698);
    FeatureType::~FeatureType(&local_6a8);
    poVar12 = std::operator<<(local_668,"\'output confidence\' is ");
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    FeatureType::FeatureType(&local_6d8,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_6c8,&local_6d8);
    poVar12 = std::operator<<(poVar12,(string *)&local_6c8);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_6c8);
    FeatureType::~FeatureType(&local_6d8);
    poVar12 = std::operator<<(local_668,"\'input coordinates\' are ");
    pFVar10 = Specification::FeatureDescription::type(confidence_out);
    FeatureType::FeatureType(&local_708,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_6f8,&local_708);
    poVar12 = std::operator<<(poVar12,(string *)&local_6f8);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_6f8);
    FeatureType::~FeatureType(&local_708);
    poVar12 = std::operator<<(local_668,"and \'output coordinates\' are ");
    pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
    FeatureType::FeatureType(&local_738,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_728,&local_738);
    poVar12 = std::operator<<(poVar12,(string *)&local_728);
    std::operator<<(poVar12,".");
    std::__cxx11::string::~string((string *)&local_728);
    FeatureType::~FeatureType(&local_738);
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_758);
    std::__cxx11::string::~string((string *)&local_758);
    coordinatesInputIndex = 1;
    std::__cxx11::stringstream::~stringstream(local_678);
    goto LAB_009bc8e7;
  }
  iVar2 = Specification::Model::specificationversion(format);
  if (iVar2 < 5) {
    if (coordinates_in_type != ArrayFeatureType_ArrayDataType_DOUBLE) {
      std::__cxx11::stringstream::stringstream(local_b48);
      poVar12 = std::operator<<(local_b38,
                                "The element data type of \'confidence\' and \'coordinates\' must be MultiArray<DOUBLE> for model specification version earlier than "
                               );
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,5);
      std::operator<<(poVar12,", but ");
      poVar12 = std::operator<<(local_b38,"\'input confidence\' is ");
      pFVar10 = Specification::FeatureDescription::type(coordinates_in);
      FeatureType::FeatureType(&local_b78,pFVar10);
      FeatureType::toString_abi_cxx11_(&local_b68,&local_b78);
      poVar12 = std::operator<<(poVar12,(string *)&local_b68);
      std::operator<<(poVar12,", ");
      std::__cxx11::string::~string((string *)&local_b68);
      FeatureType::~FeatureType(&local_b78);
      poVar12 = std::operator<<(local_b38,"\'output confidence\' is ");
      pFVar10 = Specification::FeatureDescription::type(coordinates_out);
      FeatureType::FeatureType(&local_ba8,pFVar10);
      FeatureType::toString_abi_cxx11_(&local_b98,&local_ba8);
      poVar12 = std::operator<<(poVar12,(string *)&local_b98);
      std::operator<<(poVar12,", ");
      std::__cxx11::string::~string((string *)&local_b98);
      FeatureType::~FeatureType(&local_ba8);
      poVar12 = std::operator<<(local_b38,"\'input coordinates\' are ");
      pFVar10 = Specification::FeatureDescription::type(confidence_out);
      FeatureType::FeatureType(&local_bd8,pFVar10);
      FeatureType::toString_abi_cxx11_(&local_bc8,&local_bd8);
      poVar12 = std::operator<<(poVar12,(string *)&local_bc8);
      std::operator<<(poVar12,", ");
      std::__cxx11::string::~string((string *)&local_bc8);
      FeatureType::~FeatureType(&local_bd8);
      poVar12 = std::operator<<(local_b38,"and \'output coordinates\' are ");
      pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
      FeatureType::FeatureType(&local_c08,pFVar10);
      FeatureType::toString_abi_cxx11_(&local_bf8,&local_c08);
      poVar12 = std::operator<<(poVar12,(string *)&local_bf8);
      std::operator<<(poVar12,". ");
      std::__cxx11::string::~string((string *)&local_bf8);
      FeatureType::~FeatureType(&local_c08);
      poVar12 = std::operator<<(local_b38,
                                "To enable MultiArray<FLOAT32>, use the model specification version "
                               );
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,5);
      std::operator<<(poVar12," or later.");
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c28);
      std::__cxx11::string::~string((string *)local_c28);
      coordinatesInputIndex = 1;
      std::__cxx11::stringstream::~stringstream(local_b48);
      goto LAB_009bc8e7;
    }
  }
  else if ((coordinates_in_type != ArrayFeatureType_ArrayDataType_DOUBLE) &&
          (coordinates_in_type != ArrayFeatureType_ArrayDataType_FLOAT32)) {
    std::__cxx11::stringstream::stringstream(local_8e0);
    std::operator<<(local_8d0,
                    "The element data type of \'confidence\' and \'coordinates\' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but "
                   );
    poVar12 = std::operator<<(local_8d0,"\'input confidence\' is ");
    pFVar10 = Specification::FeatureDescription::type(coordinates_in);
    FeatureType::FeatureType(&local_910,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_900,&local_910);
    poVar12 = std::operator<<(poVar12,(string *)&local_900);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_900);
    FeatureType::~FeatureType(&local_910);
    poVar12 = std::operator<<(local_8d0,"\'output confidence\' is ");
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    FeatureType::FeatureType(&local_940,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_930,&local_940);
    poVar12 = std::operator<<(poVar12,(string *)&local_930);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_930);
    FeatureType::~FeatureType(&local_940);
    poVar12 = std::operator<<(local_8d0,"\'input coordinates\' are ");
    pFVar10 = Specification::FeatureDescription::type(confidence_out);
    FeatureType::FeatureType(&local_970,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_960,&local_970);
    poVar12 = std::operator<<(poVar12,(string *)&local_960);
    std::operator<<(poVar12,", ");
    std::__cxx11::string::~string((string *)&local_960);
    FeatureType::~FeatureType(&local_970);
    poVar12 = std::operator<<(local_8d0,"and \'output coordinates\' are ");
    pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
    FeatureType::FeatureType(&local_9a0,pFVar10);
    FeatureType::toString_abi_cxx11_(&local_990,&local_9a0);
    poVar12 = std::operator<<(poVar12,(string *)&local_990);
    std::operator<<(poVar12,".");
    std::__cxx11::string::~string((string *)&local_990);
    FeatureType::~FeatureType(&local_9a0);
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_9c0);
    std::__cxx11::string::~string((string *)&local_9c0);
    coordinatesInputIndex = 1;
    std::__cxx11::stringstream::~stringstream(local_8e0);
    goto LAB_009bc8e7;
  }
  pFVar10 = Specification::FeatureDescription::type(coordinates_out);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  iVar4 = Specification::ArrayFeatureType::shape_size(pAVar11);
  confNewShapeDim = (size_t)iVar4;
  pFVar10 = Specification::FeatureDescription::type(coordinates_out);
  pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
  sStack_c40 = validate<(MLModelType)610>::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)((long)&confOldShapeDim + 7),pAVar11);
  local_12b9 = confNewShapeDim == 0 && sStack_c40 == 0;
  local_c41 = local_12b9;
  bVar1 = confNewShapeDim == 2;
  bVar22 = sStack_c40 == 0;
  local_12ba = bVar1 && bVar22;
  local_c42 = local_12ba;
  bVar23 = confNewShapeDim == 0;
  bVar24 = sStack_c40 == 2;
  local_12bb = bVar23 && bVar24;
  local_c43 = local_12bb;
  if (((confNewShapeDim != 0 || sStack_c40 != 0) && (!bVar1 || !bVar22)) && (!bVar23 || !bVar24)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c68,
               "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes."
               ,&local_c69);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c68);
    std::__cxx11::string::~string((string *)local_c68);
    std::allocator<char>::~allocator((allocator<char> *)&local_c69);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  local_12c9 = confNewShapeDim == 0 && sStack_c40 == 0;
  local_c6a = local_12c9;
  bVar25 = confNewShapeDim == 2;
  bVar26 = sStack_c40 == 0;
  local_12ca = bVar25 && bVar26;
  local_c6b = local_12ca;
  bVar27 = confNewShapeDim == 0;
  bVar28 = sStack_c40 == 2;
  local_12cb = bVar27 && bVar28;
  local_c6c = local_12cb;
  if (((confNewShapeDim != 0 || sStack_c40 != 0) && (!bVar25 || !bVar26)) && (!bVar27 || !bVar28)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c90,
               "If shape information is provided for coordinates output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes."
               ,&local_c91);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::allocator<char>::~allocator((allocator<char> *)&local_c91);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  if (((bVar1 && bVar22) && (!bVar25 || !bVar26)) || ((bVar23 && bVar24 && (!bVar27 || !bVar28)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_cb8,
               "Confidence and coordinates cannot use a mix of shape (deprecated) and allowedShapes."
               ,&local_cb9);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_cb8);
    std::__cxx11::string::~string((string *)&local_cb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
  if ((bVar1 && bVar22) && (bVar25 && bVar26)) {
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    iVar13 = Specification::ArrayFeatureType::shape(pAVar11,0);
    pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    iVar14 = Specification::ArrayFeatureType::shape(pAVar11,0);
    if (iVar13 != iVar14) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_ce0,
                 "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0)."
                 ,&local_ce1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_ce0);
      std::__cxx11::string::~string((string *)local_ce0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  if (((local_c43 & 1U) != 0) && ((local_c6c & 1U) != 0)) {
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    sVar15 = validate<(MLModelType)610>::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&confOldShapeDim + 4),pAVar11);
    local_ce2 = sVar15 != 0;
    pFVar10 = Specification::FeatureDescription::type(_confidence_out_type);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    sVar15 = validate<(MLModelType)610>::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&confOldShapeDim + 4),pAVar11);
    local_ce3 = sVar15 != 0;
    if (((local_ce2 & 1) == 0) || (!(bool)local_ce3)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d08,
                 "Confidence and coordinates output shapes fexibility must both be ranges",
                 (allocator *)((long)&confRange + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d08);
      std::__cxx11::string::~string((string *)&local_d08);
      std::allocator<char>::~allocator((allocator<char> *)((long)&confRange + 7));
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    pAVar16 = Specification::ArrayFeatureType::shaperange(pAVar11);
    coordRange = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar16);
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    pAVar16 = Specification::ArrayFeatureType::shaperange(pAVar11);
    local_d20 = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar16);
    pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                        (coordRange,0);
    uVar18 = Specification::SizeRange::lowerbound(pSVar17);
    pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                        (local_d20,0);
    uVar19 = Specification::SizeRange::lowerbound(pSVar17);
    if (uVar18 == uVar19) {
      pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                          (coordRange,0);
      iVar13 = Specification::SizeRange::upperbound(pSVar17);
      pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                          (local_d20,0);
      iVar14 = Specification::SizeRange::upperbound(pSVar17);
      if (iVar13 == iVar14) goto LAB_009bc33b;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&numLabelNames,
               "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0)."
               ,&local_d41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numLabelNames);
    std::__cxx11::string::~string((string *)&numLabelNames);
    std::allocator<char>::~allocator((allocator<char> *)&local_d41);
    coordinatesInputIndex = 1;
    goto LAB_009bc8e7;
  }
LAB_009bc33b:
  CVar5 = Specification::NonMaximumSuppression::ClassLabels_case(this_00);
  if (CVar5 == CLASSLABELS_NOT_SET) {
    local_d48 = 0;
  }
  else if (CVar5 == kStringClassLabels) {
    this_02 = Specification::NonMaximumSuppression::stringclasslabels(this_00);
    local_d48 = Specification::StringVector::vector_size(this_02);
  }
  else if (CVar5 == kInt64ClassLabels) {
    this_01 = Specification::NonMaximumSuppression::int64classlabels(this_00);
    local_d48 = Specification::Int64Vector::vector_size(this_01);
  }
  if (((local_c42 & 1U) != 0) && (0 < local_d48)) {
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    iVar13 = Specification::ArrayFeatureType::shape(pAVar11,1);
    if (iVar13 != local_d48) {
      std::__cxx11::to_string(&local_de8,local_d48);
      std::operator+(&local_dc8,"Number of classes is not consistent for class labels (",&local_de8)
      ;
      std::operator+(&local_da8,&local_dc8,") and dimension 1 of output confidence shape (");
      pFVar10 = Specification::FeatureDescription::type(coordinates_out);
      pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
      iVar13 = Specification::ArrayFeatureType::shape(pAVar11,1);
      std::__cxx11::to_string((string *)&confRange_1,iVar13);
      std::operator+(&local_d88,&local_da8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &confRange_1);
      std::operator+(&local_d68,&local_d88,")");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d68);
      std::__cxx11::string::~string((string *)&local_d68);
      std::__cxx11::string::~string((string *)&local_d88);
      std::__cxx11::string::~string((string *)&confRange_1);
      std::__cxx11::string::~string((string *)&local_da8);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::__cxx11::string::~string((string *)&local_de8);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
  }
  if (((local_c43 & 1U) != 0) && (0 < local_d48)) {
    pFVar10 = Specification::FeatureDescription::type(coordinates_out);
    pAVar11 = Specification::FeatureType::multiarraytype(pFVar10);
    pAVar16 = Specification::ArrayFeatureType::shaperange(pAVar11);
    local_e10 = Specification::ArrayFeatureType_ShapeRange::sizeranges(pAVar16);
    uVar20 = (ulong)local_d48;
    pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                        (local_e10,1);
    uVar18 = Specification::SizeRange::lowerbound(pSVar17);
    if (uVar20 < uVar18) {
LAB_009bc7d5:
      std::__cxx11::to_string(&local_e70,local_d48);
      std::operator+(&local_e50,"Number of classes is not consistent for class labels (",&local_e70)
      ;
      std::operator+(&local_e30,&local_e50,") and dimension 1 of output confidence shape range");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e30);
      std::__cxx11::string::~string((string *)&local_e30);
      std::__cxx11::string::~string((string *)&local_e50);
      std::__cxx11::string::~string((string *)&local_e70);
      coordinatesInputIndex = 1;
      goto LAB_009bc8e7;
    }
    pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                        (local_e10,1);
    iVar13 = Specification::SizeRange::upperbound(pSVar17);
    if (-1 < iVar13) {
      lVar21 = (long)local_d48;
      pSVar17 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::operator[]
                          (local_e10,1);
      iVar13 = Specification::SizeRange::upperbound(pSVar17);
      if (iVar13 < lVar21) goto LAB_009bc7d5;
    }
  }
  Result::Result(__return_storage_ptr__,(Result *)local_60);
  coordinatesInputIndex = 1;
LAB_009bc8e7:
  Result::~Result((Result *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_nonMaximumSuppression>(const Specification::Model& format) {
        const auto& description = format.description();
        const auto& nms = format.nonmaximumsuppression();
        
        //const auto& _confidenceInputFeatureName = nms.confidenceinputfeaturename();
        const auto& inputs = description.input();
        const auto& outputs = description.output();
        
        // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;
        
        Result result;
        
        // Validate it's an MLModel type
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        int confidenceInputIndex = -1;
        int coordinatesInputIndex = -1;
        int iouThresholdInputIndex = -1;
        int confidenceThresholdInputIndex = -1;
        
        // Make sure each input corresponds a feature name
        for (int i = 0; i < inputs.size(); ++i) {
            const std::string& name = inputs[i].name();
            bool used = false;
            
            if (nms.confidenceinputfeaturename().compare(name) == 0) {
                confidenceInputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesinputfeaturename().compare(name) == 0) {
                coordinatesInputIndex = i;
                used = true;
            }
            
            if (nms.iouthresholdinputfeaturename().compare(name) == 0) {
                iouThresholdInputIndex = i;
                used = true;
            }
            
            if (nms.confidencethresholdinputfeaturename().compare(name) == 0) {
                confidenceThresholdInputIndex = i;
                used = true;
            }
            
            // The input was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Input feature '" + name + "' was not requested by any of the input feature names (e.g. confidenceInputFeatureName).");
            }
        }
        
        if (confidenceInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceinputfeaturename() + "' (as defined by confidenceInputFeatureName) to the model is not present in the model description.");
        }
        
        if (coordinatesInputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesinputfeaturename() + "' (as defined by coordinatesInputFeatureName) to the model is not present in the model description.");
        }
        
        int confidenceOutputIndex = -1;
        int coordinatesOutputIndex = -1;
        
        for (int i = 0; i < outputs.size(); ++i) {
            const std::string& name = outputs[i].name();
            bool used = false;
            
            if (nms.confidenceoutputfeaturename().compare(name) == 0) {
                confidenceOutputIndex = i;
                used = true;
            }
            
            if (nms.coordinatesoutputfeaturename().compare(name) == 0) {
                coordinatesOutputIndex = i;
                used = true;
            }
            
            // The output was never used
            if (!used) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not requested by any of the output feature names (e.g. confidenceOutputFeatureName).");
            }
        }
        
        if (confidenceOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.confidenceoutputfeaturename() + "' (as defined by confidenceOutputFeatureName) from the model is not present in the model description.");
        }
        
        if (coordinatesOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + nms.coordinatesoutputfeaturename() + "' (as defined by coordinatesOutputFeatureName) from the model is not present in the model description.");
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.confidenceinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                   nms.coordinatesinputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the optional inputs
        if (iouThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.iouthresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        
        if (confidenceThresholdInputIndex >= 0) {
            result = validateDescriptionsContainFeatureWithNameAndType(description.input(),
                                                                       nms.confidencethresholdinputfeaturename(),
                                                                       {FT::kDoubleType});
            if (!result.good()) {
                return result;
            }
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.confidenceoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   nms.coordinatesoutputfeaturename(),
                                                                   {FT::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        if (!(nms.iouthreshold() >= 0.0 && nms.iouthreshold() <= 1.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "iouThreshold must be a value between 0.0 and 1.0.");
            
        }
        
        // Confidence can be greater than 1.0 if the user chooses to have non-probabilistic confidences.
        // However, since 0.0 is considered no confidence and used as a filler value when output shape
        // is larger than number of suppressed predictions, non-negative values are not allowed.
        if (!(nms.confidencethreshold() >= 0.0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "confidenceThreshold must be a non-negative value. If you do not want to eliminate any predictions based on confidence, set it to 0.0.");
            
        }
        
        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& confidence_in = description.input()[confidenceInputIndex];
        const auto& coordinates_in = description.input()[coordinatesInputIndex];
        const auto& confidence_out = description.output()[confidenceOutputIndex];
        const auto& coordinates_out = description.output()[coordinatesOutputIndex];

        const auto confidence_in_type = confidence_in.type().multiarraytype().datatype();
        const auto confidence_out_type = confidence_out.type().multiarraytype().datatype();
        const auto coordinates_in_type = coordinates_in.type().multiarraytype().datatype();
        const auto coordinates_out_type = coordinates_out.type().multiarraytype().datatype();

        if (confidence_in_type != confidence_out_type ||
            confidence_in_type != coordinates_in_type ||
            confidence_in_type != coordinates_out_type) {
            std::stringstream ss;
            ss << "'confidence' and 'coordinates' must use a same element type, but ";
            ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
            ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
            ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
            ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }

        if (format.specificationversion() >= MLMODEL_SPECIFICATION_VERSION_IOS14) {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE &&
                confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be either MultiArray<DOUBLE> or MultiArray<FLOAT32>, but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ".";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        } else {
            if (confidence_in_type != Specification::ArrayFeatureType_ArrayDataType_DOUBLE) {
                std::stringstream ss;
                ss << "The element data type of 'confidence' and 'coordinates' must be MultiArray<DOUBLE> for model specification version earlier than " << MLMODEL_SPECIFICATION_VERSION_IOS14 << ", but ";
                ss << "'input confidence' is " <<  FeatureType(confidence_in.type()).toString() << ", ";
                ss << "'output confidence' is " <<  FeatureType(confidence_out.type()).toString() << ", ";
                ss << "'input coordinates' are " <<  FeatureType(coordinates_in.type()).toString() << ", ";
                ss << "and 'output coordinates' are " <<  FeatureType(coordinates_out.type()).toString() << ". ";
                ss << "To enable MultiArray<FLOAT32>, use the model specification version " << MLMODEL_SPECIFICATION_VERSION_IOS14 << " or later.";

                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
        }

        auto rankOfFlexibleShape = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            switch (marray.ShapeFlexibility_case()) {
                case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                    return marray.enumeratedshapes().shapes(0).shape_size();
                case CoreML::Specification::ArrayFeatureType::kShapeRange:
                    return marray.shaperange().sizeranges_size();
                case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                    return 0;
            }
        };

        auto hasFlexibleShape  = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() !=  CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET;
        };

        auto hasEnumeratedShapes = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kEnumeratedShapes;
        };

        auto hasShapeRange = [] (const CoreML::Specification::ArrayFeatureType &marray) -> size_t {
            return marray.ShapeFlexibility_case() ==  CoreML::Specification::ArrayFeatureType::kShapeRange;
        };

        
        size_t confOldShapeDim = confidence_out.type().multiarraytype().shape_size();
        size_t confNewShapeDim = rankOfFlexibleShape(confidence_out.type().multiarraytype());

        // These three options are all allowed, anything else will fail
        bool confUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool confUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool confUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);

        if (!(confUnspecified || confUseOld || confUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for confidence output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }

        bool coordsUnspecified = (confOldShapeDim == 0 && confNewShapeDim == 0);
        bool coordsUseOld = (confOldShapeDim == 2 && confNewShapeDim == 0);
        bool coordsUseNew = (confOldShapeDim == 0 && confNewShapeDim == 2);
        
        if (!(coordsUnspecified || coordsUseOld || coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "If shape information is provided for coordinates output, 2 dimensions must be specified using either shape (deprecated) or allowedShapes.");
        }
        
        // For now, require consistent usage of new/old
        if ((confUseOld && !coordsUseOld) || (confUseNew && !coordsUseNew)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates cannot use a mix of shape (deprecated) and allowedShapes.");
        }
        
        // If both use old shape, make sure shapes are consistent
        if (confUseOld && coordsUseOld &&
            confidence_out.type().multiarraytype().shape(0) != coordinates_out.type().multiarraytype().shape(0)) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Confidence and coordinates output shapes must be consistent (must have the same size along dimension 0).");
        }
        
        // If both use new shape, make sure shapes are consistent
        if (confUseNew && coordsUseNew) {
            bool confIsRange = hasShapeRange(confidence_out.type().multiarraytype());
            bool coordsIsRange = hasShapeRange(coordinates_out.type().multiarraytype());

            // Only allow range flexibility
            if (!confIsRange || !coordsIsRange) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes fexibility must both be ranges");
            }

            // Check they have the same range across dimension 0
            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();
            const auto &coordRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if (confRange[0].lowerbound() != coordRange[0].lowerbound() ||
                confRange[0].upperbound() != coordRange[0].upperbound()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Confidence and coordinates output shapes must be consistent (must have the same range of sizes along dimension 0).");
            }
            
        }
        
        // If shape constraints on number of classes are defined, it must be consistent with
        // the number of labels.
        int numLabelNames;
        switch (nms.ClassLabels_case()) {
            case Specification::NonMaximumSuppression::kInt64ClassLabels:
                numLabelNames = nms.int64classlabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::kStringClassLabels:
                numLabelNames = nms.stringclasslabels().vector_size();
                break;
            case Specification::NonMaximumSuppression::CLASSLABELS_NOT_SET:
                numLabelNames = 0;
                break;
        }
        
        if (confUseOld && numLabelNames > 0 &&
            confidence_out.type().multiarraytype().shape(1) != numLabelNames) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape (" + std::to_string(confidence_out.type().multiarraytype().shape(1)) + ")");
        }
        
        if (confUseNew && numLabelNames > 0) {
            // Already checked confUseNew is a range above
            // Just check the range is correct

            const auto &confRange = confidence_out.type().multiarraytype().shaperange().sizeranges();

            if ((numLabelNames < confRange[1].lowerbound() ||
                  (confRange[1].upperbound() >= 0  && numLabelNames > confRange[1].upperbound()))) {
                      return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                    "Number of classes is not consistent for class labels (" + std::to_string(numLabelNames) + ") and dimension 1 of output confidence shape range");
            }
        }

        return result;
    }